

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_bd8925::HandleUploadCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  undefined1 *this_00;
  CURL_conflict *pCVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  size_type sVar4;
  reference pbVar5;
  cmMakefile *pcVar6;
  string *psVar7;
  char *pcVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint *puVar11;
  ulong uVar12;
  string_view sVar13;
  value_type local_a4a [2];
  string local_a48 [8];
  string log;
  int local_a1c;
  string local_a18;
  string_view local_9f8;
  reference local_9e8;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  string *local_9a0;
  string *netrc_option_err;
  allocator<char> local_971;
  undefined1 local_970 [8];
  string e_18;
  undefined1 local_948 [8];
  string e_17;
  undefined1 local_920 [8];
  string e_16;
  undefined1 local_8f8 [8];
  string e_15;
  undefined1 local_8d0 [8];
  string e_14;
  undefined1 local_8a8 [8];
  string e_13;
  cURLProgressHelper helper;
  undefined1 local_850 [8];
  string e_12;
  undefined1 local_828 [8];
  string e_11;
  undefined1 local_800 [8];
  string e_10;
  undefined1 local_7d8 [8];
  string e_9;
  undefined1 local_7b0 [8];
  string e_8;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  string *cainfo_err;
  undefined1 local_730 [8];
  string e_7;
  undefined1 local_708 [8];
  string e_6;
  undefined1 local_6c8 [8];
  string e_5;
  _Optional_payload_base<int> local_694;
  optional<int> v_2;
  string e_4;
  undefined1 local_660 [8];
  string e_3;
  undefined1 local_638 [8];
  string e_2;
  undefined1 local_610 [8];
  string e_1;
  undefined1 local_5e8 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_5b0;
  CURL_conflict *local_590;
  CURL *curl;
  string local_568;
  unsigned_long local_548;
  unsigned_long file_size;
  string errStr;
  FILE *fin;
  string local_510;
  undefined1 local_4f0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v_1;
  string local_4c0;
  cmValue local_4a0;
  cmValue v;
  string err;
  string local_470;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_450;
  allocator<char> local_441;
  string local_440;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  allocator<char> local_411;
  string local_410;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  allocator<char> local_3e1;
  string local_3e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c0;
  allocator<char> local_3b1;
  string local_3b0;
  cmValue local_390;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  allocator<char> local_379;
  string local_378;
  string_view local_358;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  allocator<char> local_339;
  string local_338;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  allocator<char> local_309;
  string local_308;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  allocator<char> local_2d9;
  string local_2d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  allocator<char> local_2a9;
  string local_2a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  undefined4 local_280;
  allocator<char> local_279;
  string local_278;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  undefined1 local_248 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string local_228;
  undefined1 local_208 [8];
  string netrc_file;
  string local_1e0;
  undefined1 local_1c0 [8];
  string netrc_level;
  string userpwd;
  string local_178;
  cmValue local_158;
  cmValue cainfo;
  string local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool tls_verify;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tls_version;
  undefined1 local_f0 [7];
  bool showProgress;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string url;
  string filename;
  const_iterator i;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"UPLOAD must be called with at least three arguments.",&local_41)
    ;
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00660b1f;
  }
  filename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
  this = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(&filename.field_2._M_allocated_capacity + 1);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this);
  pbVar5 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this);
  std::__cxx11::string::string((string *)(url.field_2._M_local_buf + 8),(string *)pbVar5);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this);
  pbVar5 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar5);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&filename.field_2 + 8));
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  tls_version.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._39_1_ = 0;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_120);
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"CMAKE_TLS_VERIFY",(allocator<char> *)((long)&cainfo.Value + 7));
  bVar3 = cmMakefile::IsOn(pcVar6,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo.Value + 7));
  local_121 = bVar3;
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"CMAKE_TLS_CAINFO",
             (allocator<char> *)(userpwd.field_2._M_local_buf + 0xf));
  local_158 = cmMakefile::GetDefinition(pcVar6,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)(userpwd.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(netrc_level.field_2._M_local_buf + 8));
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CMAKE_NETRC",
             (allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_1e0);
  std::__cxx11::string::string((string *)local_1c0,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  pcVar6 = cmExecutionStatus::GetMakefile(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"CMAKE_NETRC_FILE",
             (allocator<char> *)
             ((long)&curl_headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_228);
  std::__cxx11::string::string((string *)local_208,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&curl_headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_248);
  while( true ) {
    local_250._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8),&local_250);
    if (!bVar3) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
    bVar3 = std::operator==(pbVar5,"TIMEOUT");
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      local_258._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8),&local_258);
      pcVar2 = local_20;
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"UPLOAD missing time for TIMEOUT.",&local_279);
        cmExecutionStatus::SetError(pcVar2,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
        args_local._7_1_ = 0;
        local_280 = 1;
        goto LAB_00660a49;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      pcVar8 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar8);
    }
    else {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8));
      bVar3 = std::operator==(pbVar5,"INACTIVITY_TIMEOUT");
      if (bVar3) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        local_288._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8),&local_288);
        pcVar2 = local_20;
        if (!bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"UPLOAD missing time for INACTIVITY_TIMEOUT.",&local_2a9);
          cmExecutionStatus::SetError(pcVar2,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator(&local_2a9);
          args_local._7_1_ = 0;
          local_280 = 1;
          goto LAB_00660a49;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar8);
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
        bVar3 = std::operator==(pbVar5,"LOG");
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8));
          local_2b8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
          bVar3 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8),&local_2b8);
          pcVar2 = local_20;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d8,"UPLOAD missing VAR for LOG.",&local_2d9);
            cmExecutionStatus::SetError(pcVar2,&local_2d8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::allocator<char>::~allocator(&local_2d9);
            args_local._7_1_ = 0;
            local_280 = 1;
            goto LAB_00660a49;
          }
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar5);
        }
        else {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          bVar3 = std::operator==(pbVar5,"STATUS");
          if (bVar3) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
            local_2e8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8),&local_2e8);
            pcVar2 = local_20;
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_308,"UPLOAD missing VAR for STATUS.",&local_309);
              cmExecutionStatus::SetError(pcVar2,&local_308);
              std::__cxx11::string::~string((string *)&local_308);
              std::allocator<char>::~allocator(&local_309);
              args_local._7_1_ = 0;
              local_280 = 1;
              goto LAB_00660a49;
            }
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar5);
          }
          else {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            bVar3 = std::operator==(pbVar5,"SHOW_PROGRESS");
            if (bVar3) {
              tls_version.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._39_1_ = 1;
            }
            else {
              pbVar5 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8));
              bVar3 = std::operator==(pbVar5,"TLS_VERSION");
              if (bVar3) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
                local_318._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8),&local_318);
                pcVar2 = local_20;
                if (!bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_338,"UPLOAD missing value for TLS_VERSION.",&local_339
                            );
                  cmExecutionStatus::SetError(pcVar2,&local_338);
                  std::__cxx11::string::~string((string *)&local_338);
                  std::allocator<char>::~allocator(&local_339);
                  args_local._7_1_ = 0;
                  local_280 = 1;
                  goto LAB_00660a49;
                }
                pbVar5 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                std::optional<std::__cxx11::string>::operator=
                          ((optional<std::__cxx11::string> *)local_120,pbVar5);
              }
              else {
                pbVar5 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                bVar3 = std::operator==(pbVar5,"TLS_VERIFY");
                if (bVar3) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
                  local_348._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local);
                  bVar3 = __gnu_cxx::operator!=
                                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8),&local_348);
                  pcVar2 = local_20;
                  if (!bVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_378,"UPLOAD missing bool value for TLS_VERIFY.",
                               &local_379);
                    cmExecutionStatus::SetError(pcVar2,&local_378);
                    std::__cxx11::string::~string((string *)&local_378);
                    std::allocator<char>::~allocator(&local_379);
                    args_local._7_1_ = 0;
                    local_280 = 1;
                    goto LAB_00660a49;
                  }
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                  sVar13 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)pbVar5);
                  local_358 = sVar13;
                  local_121 = cmIsOn(sVar13);
                }
                else {
                  pbVar5 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                  bVar3 = std::operator==(pbVar5,"TLS_CAINFO");
                  if (bVar3) {
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
                    local_388._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
                    bVar3 = __gnu_cxx::operator!=
                                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8),&local_388);
                    pcVar2 = local_20;
                    if (!bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3b0,"UPLOAD missing file value for TLS_CAINFO.",
                                 &local_3b1);
                      cmExecutionStatus::SetError(pcVar2,&local_3b0);
                      std::__cxx11::string::~string((string *)&local_3b0);
                      std::allocator<char>::~allocator(&local_3b1);
                      args_local._7_1_ = 0;
                      local_280 = 1;
                      goto LAB_00660a49;
                    }
                    pbVar5 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                    cmValue::cmValue(&local_390,pbVar5);
                    local_158.Value = local_390.Value;
                  }
                  else {
                    pbVar5 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                    bVar3 = std::operator==(pbVar5,"NETRC_FILE");
                    if (bVar3) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8));
                      local_3c0._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)status_local);
                      bVar3 = __gnu_cxx::operator!=
                                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8),&local_3c0);
                      pcVar2 = local_20;
                      if (!bVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3e0,"UPLOAD missing file value for NETRC_FILE.",
                                   &local_3e1);
                        cmExecutionStatus::SetError(pcVar2,&local_3e0);
                        std::__cxx11::string::~string((string *)&local_3e0);
                        std::allocator<char>::~allocator(&local_3e1);
                        args_local._7_1_ = 0;
                        local_280 = 1;
                        goto LAB_00660a49;
                      }
                      pbVar5 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8));
                      std::__cxx11::string::operator=((string *)local_208,(string *)pbVar5);
                    }
                    else {
                      pbVar5 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8));
                      bVar3 = std::operator==(pbVar5,"NETRC");
                      if (bVar3) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                        local_3f0._M_current =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local);
                        bVar3 = __gnu_cxx::operator!=
                                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8),&local_3f0);
                        pcVar2 = local_20;
                        if (!bVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_410,"UPLOAD missing level value for NETRC.",
                                     &local_411);
                          cmExecutionStatus::SetError(pcVar2,&local_410);
                          std::__cxx11::string::~string((string *)&local_410);
                          std::allocator<char>::~allocator(&local_411);
                          args_local._7_1_ = 0;
                          local_280 = 1;
                          goto LAB_00660a49;
                        }
                        pbVar5 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)&filename.field_2 + 8));
                        std::__cxx11::string::operator=((string *)local_1c0,(string *)pbVar5);
                      }
                      else {
                        pbVar5 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)&filename.field_2 + 8));
                        bVar3 = std::operator==(pbVar5,"USERPWD");
                        if (bVar3) {
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                          local_420._M_current =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)status_local);
                          bVar3 = __gnu_cxx::operator==
                                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)((long)&filename.field_2 + 8),&local_420);
                          pcVar2 = local_20;
                          if (bVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_440,"UPLOAD missing string for USERPWD.",
                                       &local_441);
                            cmExecutionStatus::SetError(pcVar2,&local_440);
                            std::__cxx11::string::~string((string *)&local_440);
                            std::allocator<char>::~allocator(&local_441);
                            args_local._7_1_ = 0;
                            local_280 = 1;
                            goto LAB_00660a49;
                          }
                          pbVar5 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)((long)&filename.field_2 + 8));
                          std::__cxx11::string::operator=
                                    ((string *)(netrc_level.field_2._M_local_buf + 8),
                                     (string *)pbVar5);
                        }
                        else {
                          pbVar5 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)((long)&filename.field_2 + 8));
                          bVar3 = std::operator==(pbVar5,"HTTPHEADER");
                          if (bVar3) {
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                            local_450._M_current =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)status_local);
                            bVar3 = __gnu_cxx::operator==
                                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)((long)&filename.field_2 + 8),&local_450);
                            pcVar2 = local_20;
                            if (bVar3) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_470,
                                         "UPLOAD missing string for HTTPHEADER.",
                                         (allocator<char> *)(err.field_2._M_local_buf + 0xf));
                              cmExecutionStatus::SetError(pcVar2,&local_470);
                              std::__cxx11::string::~string((string *)&local_470);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(err.field_2._M_local_buf + 0xf));
                              args_local._7_1_ = 0;
                              local_280 = 1;
                              goto LAB_00660a49;
                            }
                            pbVar5 = __gnu_cxx::
                                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)((long)&filename.field_2 + 8));
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_248,pbVar5);
                          }
                          else {
                            pbVar5 = __gnu_cxx::
                                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)((long)&filename.field_2 + 8));
                            cmStrCat<char_const(&)[22],std::__cxx11::string_const&>
                                      ((string *)&v,(char (*) [22])"Unexpected argument: ",pbVar5);
                            pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                            cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,(string *)&v);
                            std::__cxx11::string::~string((string *)&v);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&filename.field_2 + 8));
  }
  bVar3 = std::optional::operator_cast_to_bool((optional *)local_120);
  if (!bVar3) {
    pcVar6 = cmExecutionStatus::GetMakefile(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"CMAKE_TLS_VERSION",
               (allocator<char> *)
               &v_1.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0x27);
    local_4a0 = cmMakefile::GetDefinition(pcVar6,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &v_1.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0x27);
    bVar3 = cmValue::operator_cast_to_bool(&local_4a0);
    if (bVar3) {
      psVar7 = cmValue::operator*[abi_cxx11_(&local_4a0);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)local_120,psVar7);
    }
  }
  bVar3 = std::optional::operator_cast_to_bool((optional *)local_120);
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"CMAKE_TLS_VERSION",(allocator<char> *)((long)&fin + 7));
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4f0,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fin + 7));
    bVar3 = std::optional::operator_cast_to_bool((optional *)local_4f0);
    if (bVar3) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_120,
                (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_4f0);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_4f0);
  }
  errStr.field_2._8_8_ = cmsys::SystemTools::Fopen((string *)((long)&url.field_2 + 8),"rb");
  if ((FILE *)errStr.field_2._8_8_ == (FILE *)0x0) {
    cmStrCat<char_const(&)[26],std::__cxx11::string&,char_const(&)[15]>
              ((string *)&file_size,(char (*) [26])"UPLOAD cannot open file \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&url.field_2 + 8),(char (*) [15])"\' for reading.");
    cmExecutionStatus::SetError(local_20,(string *)&file_size);
    args_local._7_1_ = 0;
    local_280 = 1;
    std::__cxx11::string::~string((string *)&file_size);
  }
  else {
    local_548 = cmsys::SystemTools::FileLength((string *)((long)&url.field_2 + 8));
    std::__cxx11::string::string((string *)&curl,(string *)&timeout);
    cmCurlFixFileURL(&local_568,(string *)&curl);
    std::__cxx11::string::operator=((string *)&timeout,(string *)&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&curl);
    curl_global_init(3);
    local_590 = curl_easy_init();
    pcVar2 = local_20;
    if (local_590 == (CURL_conflict *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5b0,"UPLOAD error initializing curl.",
                 (allocator<char> *)((long)&g_curl.Easy + 7));
      cmExecutionStatus::SetError(pcVar2,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
      fclose((FILE *)errStr.field_2._8_8_);
      args_local._7_1_ = 0;
      local_280 = 1;
    }
    else {
      cURLEasyGuard::cURLEasyGuard((cURLEasyGuard *)&stack0xfffffffffffffa40,local_590);
      e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_FAILONERROR,1);
      if (e.field_2._12_4_ == CURLE_OK) {
        e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_UPLOAD,1);
        pCVar1 = local_590;
        if (e.field_2._12_4_ == CURLE_OK) {
          uVar9 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(pCVar1,CURLOPT_URL,uVar9);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ =
                 curl_easy_setopt(local_590,CURLOPT_WRITEFUNCTION,cmWriteToMemoryCallback);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ =
                   curl_easy_setopt(local_590,CURLOPT_DEBUGFUNCTION,cmFileCommandCurlDebugCallback);
              if (e.field_2._12_4_ == CURLE_OK) {
                bVar3 = std::optional::operator_cast_to_bool((optional *)local_120);
                if (bVar3) {
                  pbVar10 = std::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_120);
                  sVar13 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)pbVar10);
                  e_5.field_2._8_8_ = sVar13._M_len;
                  local_694 = (_Optional_payload_base<int>)cmCurlParseTLSVersion(sVar13);
                  bVar3 = std::optional::operator_cast_to_bool((optional *)&local_694);
                  pcVar2 = local_20;
                  pCVar1 = local_590;
                  if (bVar3) {
                    puVar11 = (uint *)std::optional<int>::operator*((optional<int> *)&local_694);
                    e.field_2._12_4_ = curl_easy_setopt(pCVar1,CURLOPT_SSLVERSION,(ulong)*puVar11);
                    if (e.field_2._12_4_ == CURLE_OK) {
                      e.field_2._12_4_ = 0;
                      goto LAB_0065f5f4;
                    }
                    pbVar10 = std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_120);
                    cmStrCat<char_const(&)[35],std::__cxx11::string&,char_const(&)[3]>
                              ((string *)local_6c8,
                               (char (*) [35])"UPLOAD cannot set TLS/SSL version ",pbVar10,
                               (char (*) [3])0x11460c8);
                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_6c8,pcVar8);
                    cmExecutionStatus::SetError(local_20,(string *)local_6c8);
                    args_local._7_1_ = 0;
                    local_280 = 1;
                    std::__cxx11::string::~string((string *)local_6c8);
                  }
                  else {
                    pbVar10 = std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_120);
                    cmStrCat<char_const(&)[38],std::__cxx11::string&>
                              ((string *)((long)&e_6.field_2 + 8),
                               (char (*) [38])"UPLOAD given unknown TLS/SSL version ",pbVar10);
                    cmExecutionStatus::SetError(pcVar2,(string *)((long)&e_6.field_2 + 8));
                    std::__cxx11::string::~string((string *)(e_6.field_2._M_local_buf + 8));
                    args_local._7_1_ = 0;
                    local_280 = 1;
                  }
                }
                else {
LAB_0065f5f4:
                  if ((local_121 & 1) == 0) {
                    e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_SSL_VERIFYPEER,0);
                    if (e.field_2._12_4_ == CURLE_OK) goto LAB_0065f81d;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_730,"UPLOAD cannot set TLS/SSL Verify off: ",
                               (allocator<char> *)((long)&cainfo_err + 7));
                    std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo_err + 7));
                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_730,pcVar8);
                    cmExecutionStatus::SetError(local_20,(string *)local_730);
                    args_local._7_1_ = 0;
                    local_280 = 1;
                    std::__cxx11::string::~string((string *)local_730);
                  }
                  else {
                    e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_SSL_VERIFYPEER,1);
                    if (e.field_2._12_4_ == CURLE_OK) {
LAB_0065f81d:
                      pCVar1 = local_590;
                      psVar7 = cmValue::operator_cast_to_string_(&local_158);
                      cmCurlSetCAInfo((string *)
                                      &chunkResponse.super__Vector_base<char,_std::allocator<char>_>
                                       ._M_impl.field_0x10,pCVar1,psVar7);
                      uVar12 = std::__cxx11::string::empty();
                      if ((uVar12 & 1) == 0) {
                        cmExecutionStatus::SetError
                                  (local_20,(string *)
                                            &chunkResponse.
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .field_0x10);
                        args_local._7_1_ = 0;
                        local_280 = 1;
                      }
                      else {
                        this_00 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.field_0x10;
                        std::vector<char,_std::allocator<char>_>::vector
                                  ((vector<char,_std::allocator<char>_> *)this_00);
                        std::vector<char,_std::allocator<char>_>::vector
                                  ((vector<char,_std::allocator<char>_> *)((long)&e_8.field_2 + 8));
                        e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_WRITEDATA,this_00);
                        if (e.field_2._12_4_ == CURLE_OK) {
                          e.field_2._12_4_ =
                               curl_easy_setopt(local_590,CURLOPT_DEBUGDATA,
                                                (undefined1 *)((long)&e_8.field_2 + 8));
                          if (e.field_2._12_4_ == CURLE_OK) {
                            e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_FOLLOWLOCATION,1);
                            if (e.field_2._12_4_ == CURLE_OK) {
                              uVar12 = std::__cxx11::string::empty();
                              if ((uVar12 & 1) == 0) {
                                e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_VERBOSE,1);
                                if (e.field_2._12_4_ != CURLE_OK) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_828,"UPLOAD cannot set verbose: ",
                                             (allocator<char> *)(e_12.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_12.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_828,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_828);
                                  args_local._7_1_ = 0;
                                  local_280 = 1;
                                  std::__cxx11::string::~string((string *)local_828);
                                  goto LAB_006609dd;
                                }
                                e.field_2._12_4_ = 0;
                              }
                              if (0 < inactivity_timeout) {
                                e.field_2._12_4_ =
                                     curl_easy_setopt(local_590,CURLOPT_TIMEOUT,inactivity_timeout);
                                if (e.field_2._12_4_ != CURLE_OK) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_850,"UPLOAD cannot set timeout: ",
                                             (allocator<char> *)
                                             (helper.Text.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             (helper.Text.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_850,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_850);
                                  args_local._7_1_ = 0;
                                  local_280 = 1;
                                  std::__cxx11::string::~string((string *)local_850);
                                  goto LAB_006609dd;
                                }
                                e.field_2._12_4_ = 0;
                              }
                              if (0 < (long)logVar.field_2._8_8_) {
                                curl_easy_setopt(local_590,CURLOPT_LOW_SPEED_LIMIT,1);
                                curl_easy_setopt(local_590,CURLOPT_LOW_SPEED_TIME,
                                                 logVar.field_2._8_8_);
                              }
                              pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                              cURLProgressHelper::cURLProgressHelper
                                        ((cURLProgressHelper *)((long)&e_13.field_2 + 8),pcVar6,
                                         "upload");
                              if ((tls_version.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._39_1_ & 1) == 0) {
LAB_006601e3:
                                e.field_2._12_4_ =
                                     curl_easy_setopt(local_590,CURLOPT_READDATA,
                                                      errStr.field_2._8_8_);
                                if (e.field_2._12_4_ == CURLE_OK) {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_590,CURLOPT_INFILESIZE,local_548);
                                  if (e.field_2._12_4_ == CURLE_OK) {
                                    uVar12 = std::__cxx11::string::empty();
                                    pCVar1 = local_590;
                                    if ((uVar12 & 1) == 0) {
                                      uVar9 = std::__cxx11::string::c_str();
                                      e.field_2._12_4_ =
                                           curl_easy_setopt(pCVar1,CURLOPT_USERPWD,uVar9);
                                      if (e.field_2._12_4_ != CURLE_OK) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)local_970,
                                                   "UPLOAD cannot set user password: ",&local_971);
                                        std::allocator<char>::~allocator(&local_971);
                                        pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                        std::__cxx11::string::operator+=((string *)local_970,pcVar8)
                                        ;
                                        cmExecutionStatus::SetError(local_20,(string *)local_970);
                                        args_local._7_1_ = 0;
                                        local_280 = 1;
                                        std::__cxx11::string::~string((string *)local_970);
                                        goto LAB_006609c1;
                                      }
                                    }
                                    cmsys::SystemTools::UpperCase
                                              ((string *)&netrc_option_err,(string *)local_1c0);
                                    std::__cxx11::string::operator=
                                              ((string *)local_1c0,(string *)&netrc_option_err);
                                    std::__cxx11::string::~string((string *)&netrc_option_err);
                                    cmCurlSetNETRCOption
                                              ((string *)&headers,local_590,(string *)local_1c0,
                                               (string *)local_208);
                                    local_9a0 = (string *)&headers;
                                    uVar12 = std::__cxx11::string::empty();
                                    if ((uVar12 & 1) == 0) {
                                      cmExecutionStatus::SetError(local_20,local_9a0);
                                      args_local._7_1_ = 0;
                                    }
                                    else {
                                      __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)0x0;
                                      __end1 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_248);
                                      h = (string *)
                                          std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_248);
                                      while( true ) {
                                        bVar3 = __gnu_cxx::operator!=
                                                          (&__end1,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&h);
                                        if (!bVar3) break;
                                        local_9e8 = __gnu_cxx::
                                                                                                        
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&__end1);
                                        pcVar8 = (char *)std::__cxx11::string::c_str();
                                        __range1 = (
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)curl_slist_append((curl_slist *)__range1,pcVar8)
                                        ;
                                        __gnu_cxx::
                                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::operator++(&__end1);
                                      }
                                      curl_easy_setopt(local_590,CURLOPT_HTTPHEADER,__range1);
                                      e.field_2._12_4_ = curl_easy_perform(local_590);
                                      curl_slist_free_all((curl_slist *)__range1);
                                      cURLEasyGuard::release
                                                ((cURLEasyGuard *)&stack0xfffffffffffffa40);
                                      curl_easy_cleanup(local_590);
                                      uVar12 = std::__cxx11::string::empty();
                                      if ((uVar12 & 1) == 0) {
                                        pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                                        local_a1c = e.field_2._12_4_;
                                        log.field_2._8_8_ = curl_easy_strerror(e.field_2._12_4_);
                                        cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>
                                                  (&local_a18,&local_a1c,(char (*) [3])0x111dfbf,
                                                   (char **)((long)&log.field_2 + 8),
                                                   (char (*) [2])0x11593aa);
                                        local_9f8 = (string_view)
                                                    std::__cxx11::string::
                                                    operator_cast_to_basic_string_view
                                                              ((string *)&local_a18);
                                        cmMakefile::AddDefinition
                                                  (pcVar6,(string *)local_f0,local_9f8);
                                        std::__cxx11::string::~string((string *)&local_a18);
                                      }
                                      curl_global_cleanup();
                                      fclose((FILE *)errStr.field_2._8_8_);
                                      errStr.field_2._8_8_ = 0;
                                      uVar12 = std::__cxx11::string::empty();
                                      if ((uVar12 & 1) == 0) {
                                        std::__cxx11::string::string(local_a48);
                                        bVar3 = std::vector<char,_std::allocator<char>_>::empty
                                                          ((vector<char,_std::allocator<char>_> *)
                                                           &chunkDebug.
                                                                                                                        
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                                        if (!bVar3) {
                                          local_a4a[1] = 0;
                                          std::vector<char,_std::allocator<char>_>::push_back
                                                    ((vector<char,_std::allocator<char>_> *)
                                                     &chunkDebug.
                                                                                                            
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10,local_a4a + 1);
                                          std::__cxx11::string::operator+=(local_a48,"Response:\n");
                                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                             ((vector<char,_std::allocator<char>_> *
                                                              )&chunkDebug.
                                                                                                                                
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                                          std::__cxx11::string::operator+=(local_a48,pcVar8);
                                          std::__cxx11::string::operator+=(local_a48,"\n");
                                        }
                                        bVar3 = std::vector<char,_std::allocator<char>_>::empty
                                                          ((vector<char,_std::allocator<char>_> *)
                                                           ((long)&e_8.field_2 + 8));
                                        if (!bVar3) {
                                          local_a4a[0] = '\0';
                                          std::vector<char,_std::allocator<char>_>::push_back
                                                    ((vector<char,_std::allocator<char>_> *)
                                                     ((long)&e_8.field_2 + 8),local_a4a);
                                          std::__cxx11::string::operator+=(local_a48,"Debug:\n");
                                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                             ((vector<char,_std::allocator<char>_> *
                                                              )((long)&e_8.field_2 + 8));
                                          std::__cxx11::string::operator+=(local_a48,pcVar8);
                                          std::__cxx11::string::operator+=(local_a48,"\n");
                                        }
                                        pcVar6 = cmExecutionStatus::GetMakefile(local_20);
                                        sVar13 = (string_view)
                                                 std::__cxx11::string::
                                                 operator_cast_to_basic_string_view(local_a48);
                                        cmMakefile::AddDefinition
                                                  (pcVar6,(string *)((long)&statusVar.field_2 + 8),
                                                   sVar13);
                                        std::__cxx11::string::~string(local_a48);
                                      }
                                      args_local._7_1_ = 1;
                                    }
                                    local_280 = 1;
                                    std::__cxx11::string::~string((string *)&headers);
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)local_948,
                                               "UPLOAD cannot set input file size: ",
                                               (allocator<char> *)(e_18.field_2._M_local_buf + 0xf))
                                    ;
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_18.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_948,pcVar8);
                                    cmExecutionStatus::SetError(local_20,(string *)local_948);
                                    args_local._7_1_ = 0;
                                    local_280 = 1;
                                    std::__cxx11::string::~string((string *)local_948);
                                  }
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_920,"UPLOAD cannot set input file: ",
                                             (allocator<char> *)(e_17.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_17.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_920,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_920);
                                  args_local._7_1_ = 0;
                                  local_280 = 1;
                                  std::__cxx11::string::~string((string *)local_920);
                                }
                              }
                              else {
                                e.field_2._12_4_ = curl_easy_setopt(local_590,CURLOPT_NOPROGRESS,0);
                                if (e.field_2._12_4_ == CURLE_OK) {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_590,CURLOPT_XFERINFOFUNCTION,
                                                        cmFileUploadProgressCallback);
                                  if (e.field_2._12_4_ == CURLE_OK) {
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(local_590,CURLOPT_XFERINFODATA,
                                                          (undefined1 *)((long)&e_13.field_2 + 8));
                                    if (e.field_2._12_4_ == CURLE_OK) {
                                      e.field_2._12_4_ = 0;
                                      goto LAB_006601e3;
                                    }
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)local_8f8,
                                               "UPLOAD cannot set progress data: ",
                                               (allocator<char> *)(e_16.field_2._M_local_buf + 0xf))
                                    ;
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_16.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_8f8,pcVar8);
                                    cmExecutionStatus::SetError(local_20,(string *)local_8f8);
                                    args_local._7_1_ = 0;
                                    local_280 = 1;
                                    std::__cxx11::string::~string((string *)local_8f8);
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)local_8d0,
                                               "UPLOAD cannot set progress function: ",
                                               (allocator<char> *)(e_15.field_2._M_local_buf + 0xf))
                                    ;
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_15.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_8d0,pcVar8);
                                    cmExecutionStatus::SetError(local_20,(string *)local_8d0);
                                    args_local._7_1_ = 0;
                                    local_280 = 1;
                                    std::__cxx11::string::~string((string *)local_8d0);
                                  }
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_8a8,
                                             "UPLOAD cannot set noprogress value: ",
                                             (allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                  std::__cxx11::string::operator+=((string *)local_8a8,pcVar8);
                                  cmExecutionStatus::SetError(local_20,(string *)local_8a8);
                                  args_local._7_1_ = 0;
                                  local_280 = 1;
                                  std::__cxx11::string::~string((string *)local_8a8);
                                }
                              }
LAB_006609c1:
                              cURLProgressHelper::~cURLProgressHelper
                                        ((cURLProgressHelper *)((long)&e_13.field_2 + 8));
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_800,
                                         "UPLOAD cannot set follow-redirect option: ",
                                         (allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                              pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                              std::__cxx11::string::operator+=((string *)local_800,pcVar8);
                              cmExecutionStatus::SetError(local_20,(string *)local_800);
                              args_local._7_1_ = 0;
                              local_280 = 1;
                              std::__cxx11::string::~string((string *)local_800);
                            }
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_7d8,"UPLOAD cannot set debug data: ",
                                       (allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_7d8,pcVar8);
                            cmExecutionStatus::SetError(local_20,(string *)local_7d8);
                            args_local._7_1_ = 0;
                            local_280 = 1;
                            std::__cxx11::string::~string((string *)local_7d8);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_7b0,"UPLOAD cannot set write data: ",
                                     (allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_7b0,pcVar8);
                          cmExecutionStatus::SetError(local_20,(string *)local_7b0);
                          args_local._7_1_ = 0;
                          local_280 = 1;
                          std::__cxx11::string::~string((string *)local_7b0);
                        }
LAB_006609dd:
                        std::vector<char,_std::allocator<char>_>::~vector
                                  ((vector<char,_std::allocator<char>_> *)((long)&e_8.field_2 + 8));
                        std::vector<char,_std::allocator<char>_>::~vector
                                  ((vector<char,_std::allocator<char>_> *)
                                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10);
                      }
                      std::__cxx11::string::~string
                                ((string *)
                                 &chunkResponse.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.field_0x10);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_708,"UPLOAD cannot set TLS/SSL Verify on: ",
                                 (allocator<char> *)(e_7.field_2._M_local_buf + 0xf));
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(e_7.field_2._M_local_buf + 0xf));
                      pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                      std::__cxx11::string::operator+=((string *)local_708,pcVar8);
                      cmExecutionStatus::SetError(local_20,(string *)local_708);
                      args_local._7_1_ = 0;
                      local_280 = 1;
                      std::__cxx11::string::~string((string *)local_708);
                    }
                  }
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)
                           &v_2.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_engaged,
                           "UPLOAD cannot set debug function: ",
                           (allocator<char> *)
                           ((long)&v_2.super__Optional_base<int,_true,_true>._M_payload.
                                   super__Optional_payload_base<int>._M_payload + 3));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&v_2.super__Optional_base<int,_true,_true>._M_payload.
                                   super__Optional_payload_base<int>._M_payload + 3));
                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=
                          ((string *)
                           &v_2.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_engaged,pcVar8);
                cmExecutionStatus::SetError
                          (local_20,(string *)
                                    &v_2.super__Optional_base<int,_true,_true>._M_payload.
                                     super__Optional_payload_base<int>._M_engaged);
                args_local._7_1_ = 0;
                local_280 = 1;
                std::__cxx11::string::~string
                          ((string *)
                           &v_2.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_engaged);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_660,"UPLOAD cannot set write function: ",
                         (allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              pcVar8 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_660,pcVar8);
              cmExecutionStatus::SetError(local_20,(string *)local_660);
              args_local._7_1_ = 0;
              local_280 = 1;
              std::__cxx11::string::~string((string *)local_660);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_638,"UPLOAD cannot set url: ",
                       (allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_638,pcVar8);
            cmExecutionStatus::SetError(local_20,(string *)local_638);
            args_local._7_1_ = 0;
            local_280 = 1;
            std::__cxx11::string::~string((string *)local_638);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_610,"UPLOAD cannot set upload flag: ",
                     (allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
          std::__cxx11::string::operator+=((string *)local_610,pcVar8);
          cmExecutionStatus::SetError(local_20,(string *)local_610);
          args_local._7_1_ = 0;
          local_280 = 1;
          std::__cxx11::string::~string((string *)local_610);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_5e8,"UPLOAD cannot set fail on error flag: ",
                   (allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        pcVar8 = curl_easy_strerror(e.field_2._12_4_);
        std::__cxx11::string::operator+=((string *)local_5e8,pcVar8);
        cmExecutionStatus::SetError(local_20,(string *)local_5e8);
        args_local._7_1_ = 0;
        local_280 = 1;
        std::__cxx11::string::~string((string *)local_5e8);
      }
      cURLEasyGuard::~cURLEasyGuard((cURLEasyGuard *)&stack0xfffffffffffffa40);
    }
  }
LAB_00660a49:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_248);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)(netrc_level.field_2._M_local_buf + 8));
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_120);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
LAB_00660b1f:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleUploadCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() < 3) {
    status.SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  auto i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  cm::optional<std::string> tls_version;
  bool tls_verify = status.GetMakefile().IsOn("CMAKE_TLS_VERIFY");
  cmValue cainfo = status.GetMakefile().GetDefinition("CMAKE_TLS_CAINFO");
  std::string userpwd;
  std::string netrc_level =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    status.GetMakefile().GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        status.SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "TLS_VERSION") {
      ++i;
      if (i != args.end()) {
        tls_version = *i;
      } else {
        status.SetError("UPLOAD missing value for TLS_VERSION.");
        return false;
      }
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmIsOn(*i);
      } else {
        status.SetError("UPLOAD missing bool value for TLS_VERIFY.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = cmValue(*i);
      } else {
        status.SetError("UPLOAD missing file value for TLS_CAINFO.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        status.SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        status.SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        status.SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = cmStrCat("Unexpected argument: ", *i);
      status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  if (!tls_version) {
    if (cmValue v = status.GetMakefile().GetDefinition("CMAKE_TLS_VERSION")) {
      tls_version = *v;
    }
  }
  if (!tls_version) {
    if (cm::optional<std::string> v =
          cmSystemTools::GetEnvVar("CMAKE_TLS_VERSION")) {
      tls_version = std::move(v);
    }
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr =
      cmStrCat("UPLOAD cannot open file '", filename, "' for reading.");
    status.SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

  url = cmCurlFixFileURL(url);

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    status.SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  if (tls_version) {
    if (cm::optional<int> v = cmCurlParseTLSVersion(*tls_version)) {
      res = ::curl_easy_setopt(curl, CURLOPT_SSLVERSION, *v);
      check_curl_result(
        res,
        cmStrCat("UPLOAD cannot set TLS/SSL version ", *tls_version, ": "));
    } else {
      status.SetError(
        cmStrCat("UPLOAD given unknown TLS/SSL version ", *tls_version));
      return false;
    }
  }

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "UPLOAD cannot set TLS/SSL Verify off: ");
  }

  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    status.SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(&status.GetMakefile(), "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CM_CURLOPT_XFERINFOFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    status.SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    status.GetMakefile().AddDefinition(
      statusVar,
      cmStrCat(static_cast<int>(res), ";\"", ::curl_easy_strerror(res), "\""));
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    status.GetMakefile().AddDefinition(logVar, log);
  }

  return true;
#else
  status.SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}